

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImNodes.cpp
# Opt level: O2

void ImNodes::BeginCanvas(CanvasState *canvas)

{
  ImGuiWindow *pIVar1;
  bool bVar2;
  ImGuiID id;
  ImU32 col;
  ImDrawList *this;
  ImGuiIO *pIVar3;
  float fVar4;
  float fVar5;
  ImVec2 IVar6;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  ImVec2 IVar7;
  ImVec2 local_a0;
  ImVec2 local_98;
  undefined8 uStack_90;
  undefined1 local_88 [16];
  ImVec4 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  ImVec2 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  canvas->_impl->prev_canvas = gCanvas;
  pIVar1 = GImGui->CurrentWindow;
  gCanvas = canvas;
  pIVar1->WriteAccessed = true;
  ImGui::PushID(canvas);
  id = ImGui::GetID("canvas");
  ImGui::ItemAdd(&pIVar1->ContentsRegionRect,id,(ImRect *)0x0);
  this = ImGui::GetWindowDrawList();
  pIVar3 = ImGui::GetIO();
  bVar2 = ImGui::IsMouseDown(0);
  if (!bVar2) {
    bVar2 = ImGui::IsWindowHovered(0);
    if (bVar2) {
      bVar2 = ImGui::IsMouseDragging(1,-1.0);
      if (bVar2) {
        IVar6.x = (canvas->offset).x + (pIVar3->MouseDelta).x;
        IVar6.y = (canvas->offset).y + (pIVar3->MouseDelta).y;
        canvas->offset = IVar6;
      }
      if (pIVar3->KeyShift == true) {
        if (pIVar3->KeyCtrl == false) {
          (canvas->offset).x = pIVar3->MouseWheel * 16.0 + (canvas->offset).x;
        }
      }
      else {
        fVar4 = pIVar3->MouseWheel;
        if (pIVar3->KeyCtrl == false) {
          (canvas->offset).y = fVar4 * 16.0 + (canvas->offset).y;
        }
        else {
          if ((fVar4 != 0.0) || (NAN(fVar4))) {
            fVar5 = fVar4 * canvas->zoom * 0.0625 + canvas->zoom;
            fVar4 = 3.0;
            if (fVar5 <= 3.0) {
              fVar4 = fVar5;
            }
            canvas->zoom = (float)(-(uint)(fVar5 < 0.3) & 0x3e99999a |
                                  ~-(uint)(fVar5 < 0.3) & (uint)fVar4);
          }
          IVar6 = ImGui::GetMouseDragDelta(0,-1.0);
          IVar7.x = (canvas->offset).x + IVar6.x;
          IVar7.y = (canvas->offset).y + IVar6.y;
          canvas->offset = IVar7;
        }
      }
    }
  }
  fVar4 = canvas->zoom * 64.0;
  local_98 = ImGui::GetWindowPos();
  local_68 = local_98.y;
  uStack_90 = extraout_XMM0_Qb;
  fStack_64 = local_68;
  fStack_60 = local_68;
  fStack_5c = local_68;
  local_58 = ImGui::GetWindowSize();
  local_48 = local_58.y;
  local_78.x = canvas->colors[0].Value.x;
  local_78.y = canvas->colors[0].Value.y;
  local_78.z = canvas->colors[0].Value.z;
  local_78.w = canvas->colors[0].Value.w;
  uStack_50 = extraout_XMM0_Qb_00;
  fStack_44 = local_48;
  fStack_40 = local_48;
  fStack_3c = local_48;
  col = ImGui::ColorConvertFloat4ToU32(&local_78);
  fVar5 = fmodf((canvas->offset).x,fVar4);
  local_88 = ZEXT416((uint)(local_68 + 0.0));
  local_38 = local_48 + local_68;
  fStack_34 = fStack_44;
  fStack_30 = fStack_40;
  fStack_2c = fStack_3c;
  for (; fVar5 < local_58.x; fVar5 = fVar5 + fVar4) {
    local_a0.x = local_98.x + fVar5;
    local_78.y = (float)local_88._0_4_;
    local_78.x = local_a0.x;
    local_a0.y = local_38;
    ImDrawList::AddLine(this,(ImVec2 *)&local_78,&local_a0,col,1.0);
  }
  fVar5 = fmodf((canvas->offset).y,fVar4);
  local_88 = ZEXT416((uint)(local_98.x + 0.0));
  local_98.y = local_98.y + local_58.y;
  local_98.x = local_98.x + local_58.x;
  uStack_90 = CONCAT44(uStack_90._4_4_ + uStack_50._4_4_,(float)uStack_90 + (float)uStack_50);
  for (; fVar5 < local_48; fVar5 = fVar5 + fVar4) {
    local_78.y = local_68 + fVar5;
    local_78.x = (float)local_88._0_4_;
    local_a0.y = local_68 + fVar5;
    local_a0.x = local_98.x;
    ImDrawList::AddLine(this,(ImVec2 *)&local_78,&local_a0,col,1.0);
  }
  ImGui::SetWindowFontScale(canvas->zoom);
  return;
}

Assistant:

void BeginCanvas(CanvasState* canvas)
{
    canvas->_impl->prev_canvas = gCanvas;
    gCanvas = canvas;
    const ImGuiWindow* w = ImGui::GetCurrentWindow();
    ImGui::PushID(canvas);

    ImGui::ItemAdd(w->ContentsRegionRect, ImGui::GetID("canvas"));

    ImDrawList* draw_list = ImGui::GetWindowDrawList();
    ImGuiIO& io = ImGui::GetIO();

    if (!ImGui::IsMouseDown(0) && ImGui::IsWindowHovered())
    {
        if (ImGui::IsMouseDragging(1))
            canvas->offset += io.MouseDelta;

        if (io.KeyShift && !io.KeyCtrl)
            canvas->offset.x += io.MouseWheel * 16.0f;

        if (!io.KeyShift && !io.KeyCtrl)
            canvas->offset.y += io.MouseWheel * 16.0f;

        if (!io.KeyShift && io.KeyCtrl)
        {
            if (io.MouseWheel != 0)
                canvas->zoom = ImClamp(canvas->zoom + io.MouseWheel * canvas->zoom / 16.f, 0.3f, 3.f);
            canvas->offset += ImGui::GetMouseDragDelta();
        }
    }

    const float grid = 64.0f * canvas->zoom;

    ImVec2 pos = ImGui::GetWindowPos();
    ImVec2 size = ImGui::GetWindowSize();

    ImU32 grid_color = ImColor(canvas->colors[ColCanvasLines]);
    for (float x = fmodf(canvas->offset.x, grid); x < size.x;)
    {
        draw_list->AddLine(ImVec2(x, 0) + pos, ImVec2(x, size.y) + pos, grid_color);
        x += grid;
    }

    for (float y = fmodf(canvas->offset.y, grid); y < size.y;)
    {
        draw_list->AddLine(ImVec2(0, y) + pos, ImVec2(size.x, y) + pos, grid_color);
        y += grid;
    }

    ImGui::SetWindowFontScale(canvas->zoom);
}